

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_test.c
# Opt level: O2

bool_t hexTest(void)

{
  bool_t bVar1;
  int iVar2;
  octet *poVar3;
  size_t count;
  octet buf [256];
  char hex1 [513];
  char hex [513];
  
  bVar1 = hexIsValid("1234");
  if ((((bVar1 != 0) && (bVar1 = hexIsValid("12345"), bVar1 == 0)) &&
      (bVar1 = hexIsValid("ABCDEFabcdef"), bVar1 != 0)) &&
     (bVar1 = hexIsValid("abcdefgh"), bVar1 == 0)) {
    count = 0;
    do {
      if (count == 0x101) {
        return 1;
      }
      poVar3 = beltH();
      hexFrom(hex,poVar3,count);
      poVar3 = beltH();
      bVar1 = hexEq(poVar3,hex);
      if (bVar1 == 0) {
        return 0;
      }
      hexTo(buf,hex);
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3,count);
      if (bVar1 == 0) {
        return 0;
      }
      poVar3 = beltH();
      hexFromRev(hex,poVar3,count);
      poVar3 = beltH();
      bVar1 = hexEqRev(poVar3,hex);
      if (bVar1 == 0) {
        return 0;
      }
      hexToRev(buf,hex);
      poVar3 = beltH();
      bVar1 = memEq(buf,poVar3,count);
      if (bVar1 == 0) {
        return 0;
      }
      memCopy(hex1,hex,0x201);
      hexLower(hex1);
      hexUpper(hex1);
      iVar2 = strCmp(hex,hex1);
      count = count + 1;
    } while (iVar2 == 0);
  }
  return 0;
}

Assistant:

bool_t hexTest()
{
	octet buf[256];
	char hex[512 + 1];
	char hex1[512 + 1];
	size_t count;
	// валидация
	if (!hexIsValid("1234") ||
		hexIsValid("12345") ||
		!hexIsValid("ABCDEFabcdef") ||
		hexIsValid("abcdefgh"))
		return FALSE;
	// кодировать / декодировать
	for (count = 0; count <= 256; ++count)
	{
		hexFrom(hex, beltH(), count);
		if (!hexEq(beltH(), hex))
			return FALSE;
		hexTo(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		hexFromRev(hex, beltH(), count);
		if (!hexEqRev(beltH(), hex))
			return FALSE;
		hexToRev(buf, hex);
		if (!memEq(buf, beltH(), count))
			return FALSE;
		memCopy(hex1, hex, sizeof(hex));
		hexLower(hex1);
		hexUpper(hex1);
		if (!strEq(hex, hex1))
			return FALSE;
	}
	// все нормально
	return TRUE;
}